

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O2

void XPK_Free(XPK *xpk)

{
  int i;
  ulong uVar1;
  
  if ((FILE *)xpk->file != (FILE *)0x0) {
    fclose((FILE *)xpk->file);
  }
  for (uVar1 = 0; uVar1 < xpk->n_entries; uVar1 = uVar1 + 1) {
    free(xpk->entries[uVar1]);
  }
  CLU_Free(xpk->clu);
  free(xpk);
  return;
}

Assistant:

void
XPK_Free(XPK *xpk)
{
	if (xpk->file) fclose(xpk->file);
	for (int i = 0; i < xpk->n_entries; i++) {
		XPKEntry_Free(xpk->entries[i]);
	}
	CLU_Free(xpk->clu);
	free(xpk);
}